

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_etc2_eac_rg11
               (uastc_block *src_blk,void *pDst,bool high_quality,uint32_t chan0,uint32_t chan1)

{
  bool bVar1;
  uint in_ECX;
  byte in_DL;
  eac_block *in_RSI;
  unpacked_uastc_block *in_RDI;
  uint in_R8D;
  bool unpack_srgb;
  color32 block_pixels [4] [4];
  uint32_t mode;
  unpacked_uastc_block unpacked_src_blk;
  color32 *in_stack_fffffffffffffec8;
  code *pcVar2;
  unpacked_uastc_block *in_stack_fffffffffffffed0;
  color32 *local_118;
  color32 local_108 [16];
  color32 acStack_c8 [14];
  void *in_stack_ffffffffffffff70;
  color32 (*in_stack_ffffffffffffff78) [4];
  unpacked_uastc_block *in_stack_ffffffffffffff80;
  int local_54;
  byte abStack_4c [40];
  uint local_24;
  uint local_20;
  byte local_19;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_19 = in_DL & 1;
  local_24 = in_R8D;
  local_20 = in_ECX;
  unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x1b03bb);
  bVar1 = unpack_uastc((uastc_block *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0));
  if (bVar1) {
    if (local_54 == 8) {
      pack_eac_solid_block(in_RSI,(uint)abStack_4c[local_20]);
      pack_eac_solid_block(in_RSI + 1,(uint)abStack_4c[local_24]);
      bVar1 = true;
    }
    else {
      local_118 = local_108;
      do {
        color32::color32(local_118);
        local_118 = local_118 + 1;
      } while (local_118 != acStack_c8);
      bVar1 = unpack_uastc(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,false);
      if (bVar1) {
        if (local_20 == 3) {
          transcode_uastc_to_etc2_eac_a8
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        }
        else {
          if ((local_19 & 1) == 0) {
            pcVar2 = pack_eac;
          }
          else {
            pcVar2 = pack_eac_high_quality;
          }
          (*pcVar2)(in_RSI,(long)&local_108[0].field_0 + (ulong)local_20,4);
        }
        if (local_24 == 3) {
          transcode_uastc_to_etc2_eac_a8
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        }
        else {
          if ((local_19 & 1) == 0) {
            pcVar2 = pack_eac;
          }
          else {
            pcVar2 = pack_eac_high_quality;
          }
          (*pcVar2)(in_RSI + 1,(long)&local_108[0].field_0 + (ulong)local_24,4);
        }
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_etc2_eac_rg11(const uastc_block& src_blk, void* pDst, bool high_quality, uint32_t chan0, uint32_t chan1)
	{
		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			pack_eac_solid_block(static_cast<eac_block*>(pDst)[0], unpacked_src_blk.m_solid_color.c[chan0]);
			pack_eac_solid_block(static_cast<eac_block*>(pDst)[1], unpacked_src_blk.m_solid_color.c[chan1]);
			return true;
		}

		color32 block_pixels[4][4];
		const bool unpack_srgb = false;
		if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
			return false;

		if (chan0 == 3)
			transcode_uastc_to_etc2_eac_a8(unpacked_src_blk, block_pixels, &static_cast<eac_block*>(pDst)[0]);
		else
			(high_quality ? pack_eac_high_quality : pack_eac)(static_cast<eac_block*>(pDst)[0], &block_pixels[0][0].c[chan0], sizeof(color32));

		if (chan1 == 3)
			transcode_uastc_to_etc2_eac_a8(unpacked_src_blk, block_pixels, &static_cast<eac_block*>(pDst)[1]);
		else
			(high_quality ? pack_eac_high_quality : pack_eac)(static_cast<eac_block*>(pDst)[1], &block_pixels[0][0].c[chan1], sizeof(color32));
		return true;
	}